

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_details::load(xr_level_details *this,xr_reader *r)

{
  pointer *pppxVar1;
  undefined8 *puVar2;
  iterator __position;
  uint8_t *puVar3;
  undefined8 uVar4;
  size_t sVar5;
  xr_reader *this_00;
  xr_dm *this_01;
  detail_slot_v3 *pdVar6;
  size_t sVar7;
  uint32_t find_id;
  ulong uVar8;
  ulong uVar9;
  xr_dm *dm;
  xr_reader *s;
  xr_dm *local_50;
  details_header *local_48;
  vector<xray_re::xr_dm*,std::allocator<xray_re::xr_dm*>> *local_40;
  xr_reader *local_38;
  
  sVar5 = xr_reader::find_chunk(r,0);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                  ,0x3a,"void xray_re::xr_level_details::load(xr_reader &)");
  }
  details_header::load(&this->m_header,r);
  if (((this->m_header).version & 0xfffffffe) != 2) {
    __assert_fail("m_header.version == DETAILS_VERSION_2 || m_header.version == DETAILS_VERSION_3",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                  ,0x3d,"void xray_re::xr_level_details::load(xr_reader &)");
  }
  uVar8 = (ulong)(this->m_header).object_count;
  if (uVar8 != 0) {
    local_40 = (vector<xray_re::xr_dm*,std::allocator<xray_re::xr_dm*>> *)&this->m_models;
    std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::reserve
              ((vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_> *)local_40,uVar8);
    this_00 = xr_reader::open_chunk(r,1);
    local_38 = this_00;
    if (this_00 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                    ,0x44,"void xray_re::xr_level_details::load(xr_reader &)");
    }
    local_48 = &this->m_header;
    sVar5 = xr_reader::find_chunk(this_00,0);
    if (sVar5 != 0) {
      find_id = 1;
      do {
        this_01 = (xr_dm *)operator_new(0x250);
        memset(this_01,0,0x250);
        xr_dm::xr_dm(this_01);
        (this_01->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory =
             (_func_int **)&PTR__xr_dm_00249aa0;
        local_50 = this_01;
        xr_dm::load_dm(this_01,this_00);
        __position._M_current =
             (this->m_models).
             super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_models).super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xray_re::xr_dm*,std::allocator<xray_re::xr_dm*>>::
          _M_realloc_insert<xray_re::xr_dm*const&>(local_40,__position,&local_50);
        }
        else {
          *__position._M_current = local_50;
          pppxVar1 = &(this->m_models).
                      super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppxVar1 = *pppxVar1 + 1;
        }
        sVar5 = xr_reader::find_chunk(this_00,find_id);
        find_id = find_id + 1;
      } while (sVar5 != 0);
    }
    xr_reader::close_chunk(r,&local_38);
    sVar5 = xr_reader::find_chunk(r,2);
    if (local_48->version == 2) {
      if ((sVar5 == 0) || (uVar8 = sVar5 / 0x16, sVar5 != uVar8 * 0x16)) {
        __assert_fail("size && (size % sizeof(detail_slot_v2) == 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                      ,0x4e,"void xray_re::xr_level_details::load(xr_reader &)");
      }
      uVar9 = uVar8 << 4;
      pdVar6 = (detail_slot_v3 *)operator_new__(uVar9);
      this->m_slots = pdVar6;
      if (0x15 < sVar5) {
        do {
          read_slot_v2::operator()((read_slot_v2 *)&local_50,pdVar6,r);
          pdVar6 = pdVar6 + 1;
          uVar9 = uVar9 - 0x10;
        } while (uVar9 != 0);
      }
    }
    else {
      if (local_48->version != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                      ,0x56,"void xray_re::xr_level_details::load(xr_reader &)");
      }
      if ((sVar5 == 0) || ((sVar5 & 0xf) != 0)) {
        __assert_fail("size && (size % sizeof(detail_slot_v3) == 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                      ,0x52,"void xray_re::xr_level_details::load(xr_reader &)");
      }
      pdVar6 = (detail_slot_v3 *)operator_new__(sVar5);
      this->m_slots = pdVar6;
      sVar7 = 0;
      puVar3 = (r->field_2).m_p;
      do {
        uVar4 = *(undefined8 *)(puVar3 + 8);
        puVar2 = (undefined8 *)(&((detail_slot_v3 *)(pdVar6->palette + -4))->field_0x0 + sVar7);
        *puVar2 = *(undefined8 *)puVar3;
        puVar2[1] = uVar4;
        (r->field_2).m_p = puVar3 + 0x10;
        sVar7 = sVar7 + 0x10;
        puVar3 = puVar3 + 0x10;
      } while (sVar5 != sVar7);
      uVar8 = sVar5 >> 4;
    }
    if (uVar8 != (this->m_header).size_z * (this->m_header).size_x) {
      __assert_fail("size == num_slots()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                    ,0x58,"void xray_re::xr_level_details::load(xr_reader &)");
    }
  }
  return;
}

Assistant:

void xr_level_details::load(xr_reader& r)
{
	if (!r.find_chunk(FSD_HEADER))
		xr_not_expected();
	m_header.load(r);
	r.debug_find_chunk();
	xr_assert(m_header.version == DETAILS_VERSION_2 || m_header.version == DETAILS_VERSION_3);

	if (m_header.object_count == 0)
		return;

	m_models.reserve(m_header.object_count);
	xr_reader* s = r.open_chunk(FSD_MESHES);
	xr_assert(s);
	for (uint32_t id = 0; s->find_chunk(id); ++id) {
		xr_dm* dm = new xr_level_dm();
		dm->load_dm(*s);
		m_models.push_back(dm);
	}
	r.close_chunk(s);

	size_t size = r.find_chunk(FSD_SLOTS);
	if (m_header.version == DETAILS_VERSION_2) {
		xr_assert(size && (size % sizeof(detail_slot_v2) == 0));
		m_slots = new detail_slot_v3[size /= sizeof(detail_slot_v2)];
		r.r_cseq(size, m_slots, read_slot_v2());
	} else if (m_header.version == DETAILS_VERSION_3) {
		xr_assert(size && (size % sizeof(detail_slot_v3) == 0));
		m_slots = new detail_slot_v3[size /= sizeof(detail_slot_v3)];
		r.r_cseq(size, m_slots);
	} else {
		xr_not_expected();
	}
	xr_assert(size == num_slots());
}